

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayCommI.H
# Opt level: O1

void __thiscall
amrex::FabArray<amrex::FArrayBox>::copyTo
          (FabArray<amrex::FArrayBox> *this,FArrayBox *dest,int scomp,int dcomp,int ncomp,int nghost
          )

{
  int iVar1;
  Periodicity *period;
  initializer_list<int> __l;
  IntVect local_284;
  DistributionMapping dm;
  undefined1 local_268 [24];
  pointer pbStack_250;
  pointer local_248;
  FabFactory<amrex::FArrayBox> local_220;
  BoxArray ba;
  FabArray<amrex::FArrayBox> destmf;
  
  iVar1 = **(int **)&(((this->super_FabArrayBase).distributionMap.m_ref.
                       super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl;
  BoxArray::BoxArray(&ba,&(dest->super_BaseFab<double>).domain);
  local_268._0_4_ = iVar1;
  __l._M_len = 1;
  __l._M_array = (iterator)local_268;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&destmf,__l,(allocator_type *)&local_284);
  DistributionMapping::DistributionMapping(&dm,(Vector<int,_std::allocator<int>_> *)&destmf);
  if (destmf.super_FabArrayBase._vptr_FabArrayBase != (_func_int **)0x0) {
    operator_delete(destmf.super_FabArrayBase._vptr_FabArrayBase,
                    destmf.super_FabArrayBase.boxarray.m_bat.m_op._4_8_ -
                    (long)destmf.super_FabArrayBase._vptr_FabArrayBase);
  }
  local_248 = (pointer)0x0;
  local_268._16_8_ = (pointer)0x0;
  pbStack_250 = (pointer)0x0;
  local_268._0_8_ = (_func_int **)0x0;
  local_268._8_8_ = (Arena *)0x0;
  local_220._vptr_FabFactory = (_func_int **)&PTR__FabFactory_0074e8d0;
  local_284.vect[0] = 0;
  local_284.vect[1] = 0;
  local_284.vect[2] = 0;
  FabArray(&destmf,&ba,&dm,ncomp,&local_284,(MFInfo *)local_268,&local_220);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_268 + 0x10));
  if (*(int *)(ParallelContext::frames + 0xc) == iVar1) {
    FArrayBox::FArrayBox((FArrayBox *)local_268,dest,make_alias,dcomp,ncomp);
    setFab<amrex::FArrayBox,_0>(&destmf,0,(FArrayBox *)local_268);
    local_268._0_8_ = &PTR__BaseFab_0074eb90;
    BaseFab<double>::clear((BaseFab<double> *)local_268);
  }
  period = Periodicity::NonPeriodic();
  local_268._4_4_ = nghost;
  local_268._0_4_ = nghost;
  local_268._8_4_ = nghost;
  local_284.vect[0] = 0;
  local_284.vect[1] = 0;
  local_284.vect[2] = 0;
  ParallelCopy_nowait(&destmf,this,scomp,0,ncomp,(IntVect *)local_268,&local_284,period,COPY,
                      (CPC *)0x0,false);
  ~FabArray(&destmf);
  if (dm.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (dm.m_ref.
               super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BoxArray::~BoxArray(&ba);
  return;
}

Assistant:

void
FabArray<FAB>::copyTo (FAB& dest, int scomp, int dcomp, int ncomp, int nghost) const
{
    BL_PROFILE("FabArray::copy(fab)");

    BL_ASSERT(dcomp + ncomp <= dest.nComp());
    BL_ASSERT(IntVect(nghost).allLE(nGrowVect()));

    int root_proc = this->DistributionMap()[0];

    BoxArray ba(dest.box());
    DistributionMapping dm(Vector<int>{root_proc});
    FabArray<FAB> destmf(ba, dm, ncomp, 0, MFInfo().SetAlloc(false));
    if (ParallelDescriptor::MyProc() == root_proc) {
        destmf.setFab(0, FAB(dest, amrex::make_alias, dcomp, ncomp));
    }

    destmf.ParallelCopy(*this, scomp, 0, ncomp, nghost, 0);

#ifdef BL_USE_MPI
    using T = typename FAB::value_type;
    if (ParallelContext::NProcsSub() > 1) {
        Long count = dest.numPts()*ncomp;
        T* const p0 = dest.dataPtr(dcomp);
        T* pb = p0;
#ifdef AMREX_USE_GPU
        if (dest.arena()->isDevice()) {
            pb = (T*)The_Pinned_Arena()->alloc(sizeof(T)*count);
            Gpu::dtoh_memcpy_async(pb, p0, sizeof(T)*count);
            Gpu::streamSynchronize();
        }
#endif
        ParallelDescriptor::Bcast(pb, count, ParallelContext::global_to_local_rank(root_proc),
                                  ParallelContext::CommunicatorSub());
#ifdef AMREX_USE_GPU
        if (pb != p0) {
            Gpu::htod_memcpy_async(p0, pb, sizeof(T)*count);
            Gpu::streamSynchronize();
        }
#endif
    }
#endif
}